

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int r1f5kf_(int *ido,int *l1,double *cc,int *in1,double *ch,int *in2,double *wa1,double *wa2,
           double *wa3,double *wa4)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  double *pdVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  double *pdVar29;
  double *local_1b8;
  double *local_1a0;
  double *local_198;
  double *local_190;
  double *local_188;
  double *local_180;
  double *local_178;
  double *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  
  iVar1 = *l1;
  if (0 < (long)iVar1) {
    lVar24 = (long)*in1;
    iVar2 = *ido;
    lVar13 = (long)iVar2;
    uVar3 = iVar1 + 1;
    iVar4 = ~(uVar3 * iVar2) * *in1 + -1;
    iVar27 = *in2;
    lVar20 = (long)iVar27;
    lVar16 = (long)(~(iVar2 * 6) * iVar27 + -1);
    iVar27 = iVar2 * iVar27;
    iVar18 = iVar27 * 10;
    iVar28 = iVar27 * 8;
    lVar14 = lVar13 * lVar20;
    pdVar9 = cc + (((ulong)(uint)(iVar1 * 3) + 1) * lVar13 + 1) * lVar24 + 1;
    lVar26 = lVar13 * lVar24;
    pdVar6 = cc + (((long)(iVar1 * 4) + 1) * lVar13 + 1) * lVar24 + 1;
    pdVar15 = cc + (((long)(iVar1 * 2) + 1) * lVar13 + 1) * lVar24 + 1;
    pdVar5 = cc + (((ulong)(uint)(iVar1 * 5) + 1) * lVar13 + 1) * lVar24 + 1;
    lVar10 = ((long)iVar1 + 1) * lVar13;
    pdVar23 = cc + (lVar10 + 1) * lVar24 + 1;
    pdVar17 = ch + lVar16 + 1;
    lVar21 = (ulong)uVar3 - 1;
    pdVar11 = pdVar17;
    do {
      pdVar11[(lVar13 * 6 + 1) * lVar20] =
           pdVar6[iVar4] + pdVar9[iVar4] + pdVar5[iVar4] + pdVar15[iVar4] + pdVar23[iVar4];
      pdVar17[iVar28] =
           (pdVar6[iVar4] + pdVar9[iVar4]) * -0.8090169943749473 +
           (pdVar5[iVar4] + pdVar15[iVar4]) * 0.30901699437494745 + pdVar23[iVar4];
      pdVar11[(lVar13 * 8 + 1) * lVar20] =
           (pdVar5[iVar4] - pdVar15[iVar4]) * 0.9510565162951535 +
           (pdVar6[iVar4] - pdVar9[iVar4]) * 0.5877852522924732;
      pdVar17[iVar18] =
           (pdVar6[iVar4] + pdVar9[iVar4]) * 0.30901699437494745 +
           (pdVar5[iVar4] + pdVar15[iVar4]) * -0.8090169943749473 + pdVar23[iVar4];
      pdVar11[(lVar13 * 10 + 1) * lVar20] =
           (pdVar5[iVar4] - pdVar15[iVar4]) * 0.5877852522924732 +
           (pdVar6[iVar4] - pdVar9[iVar4]) * -0.9510565162951535;
      iVar18 = iVar18 + iVar27 * 5;
      iVar28 = iVar28 + iVar27 * 5;
      pdVar11 = pdVar11 + lVar14 * 5;
      pdVar9 = pdVar9 + lVar26;
      pdVar6 = pdVar6 + lVar26;
      pdVar15 = pdVar15 + lVar26;
      pdVar5 = pdVar5 + lVar26;
      pdVar23 = pdVar23 + lVar26;
      lVar21 = lVar21 + -1;
    } while (lVar21 != 0);
    if (iVar2 != 1 && 0 < iVar1) {
      lVar22 = (long)(iVar2 + 2);
      local_b8 = cc + (lVar10 + 3) * lVar24 + 1;
      lVar7 = ((long)(iVar1 << 2) + 1) * lVar13;
      local_c0 = cc + (lVar7 + 3) * lVar24 + 1;
      lVar21 = ((ulong)(uint)(iVar1 * 3) + 1) * lVar13;
      local_c8 = cc + (lVar21 + 3) * lVar24 + 1;
      lVar12 = ((ulong)(uint)(iVar1 * 5) + 1) * lVar13;
      local_d0 = cc + (lVar12 + 3) * lVar24 + 1;
      lVar19 = ((long)(iVar1 * 2) + 1) * lVar13;
      local_d8 = cc + (lVar19 + 3) * lVar24 + 1;
      local_e0 = cc + (lVar10 + 2) * lVar24 + 1;
      local_e8 = cc + (lVar19 + 2) * lVar24 + 1;
      local_f0 = cc + (lVar12 + 2) * lVar24 + 1;
      local_f8 = cc + (lVar21 + 2) * lVar24 + 1;
      local_100 = cc + (lVar7 + 2) * lVar24 + 1;
      local_108 = ch + (lVar13 * 7 + lVar22 + -4) * lVar20 + 1;
      local_110 = ch + (lVar22 + -4 + lVar13 * 9) * lVar20 + 1;
      local_118 = ch + (lVar13 * 7 + -3 + lVar22) * lVar20 + 1;
      local_120 = ch + (lVar22 + -3 + lVar13 * 9) * lVar20 + 1;
      local_128 = ch + (lVar13 * 10 + 3) * lVar20 + 1;
      local_130 = ch + (lVar13 * 8 + 3) * lVar20 + 1;
      local_138 = ch + (lVar13 * 6 + 3) * lVar20 + 1;
      local_140 = ch + (lVar13 * 6 + 2) * lVar20 + 1;
      local_148 = ch + (lVar13 * 8 + 2) * lVar20 + 1;
      local_150 = ch + (lVar13 * 10 + 2) * lVar20 + 1;
      uVar8 = 1;
      do {
        if (2 < iVar2) {
          lVar21 = 3;
          local_178 = local_150;
          local_180 = local_148;
          local_b0 = local_c0;
          local_1b8 = local_b8;
          local_188 = local_138;
          local_190 = local_130;
          local_198 = local_128;
          local_1a0 = local_120;
          local_98 = local_118;
          local_a0 = local_110;
          local_a8 = local_108;
          pdVar9 = local_100;
          pdVar11 = local_140;
          pdVar5 = local_f8;
          pdVar6 = local_d8;
          pdVar17 = local_e0;
          pdVar15 = local_e8;
          pdVar23 = local_d0;
          pdVar25 = local_c8;
          pdVar29 = local_f0;
          do {
            pdVar11[lVar16] =
                 wa3[lVar21 + -3] * pdVar9[iVar4] + wa3[lVar21 + -2] * local_b0[iVar4] +
                 wa2[lVar21 + -3] * pdVar5[iVar4] + wa2[lVar21 + -2] * pdVar25[iVar4] +
                 wa4[lVar21 + -3] * pdVar29[iVar4] + wa4[lVar21 + -2] * pdVar23[iVar4] +
                 wa1[lVar21 + -3] * pdVar15[iVar4] + wa1[lVar21 + -2] * pdVar6[iVar4] +
                 pdVar17[iVar4];
            local_188[lVar16] =
                 (wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2]) +
                 (wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2]) +
                 (wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2]) +
                 (wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2]) +
                 local_1b8[iVar4];
            local_180[lVar16] =
                 ((wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2]) -
                 (wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2])) *
                 0.5877852522924732 +
                 ((wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2]) -
                 (wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2])) *
                 0.9510565162951535 +
                 (wa3[lVar21 + -2] * local_b0[iVar4] +
                 wa3[lVar21 + -3] * pdVar9[iVar4] +
                 wa2[lVar21 + -3] * pdVar5[iVar4] + wa2[lVar21 + -2] * pdVar25[iVar4]) *
                 -0.8090169943749473 +
                 (wa4[lVar21 + -2] * pdVar23[iVar4] +
                 wa4[lVar21 + -3] * pdVar29[iVar4] +
                 wa1[lVar21 + -3] * pdVar15[iVar4] + wa1[lVar21 + -2] * pdVar6[iVar4]) *
                 0.30901699437494745 + pdVar17[iVar4];
            local_a8[lVar16] =
                 ((wa3[lVar21 + -2] * local_b0[iVar4] +
                  wa3[lVar21 + -3] * pdVar9[iVar4] +
                  wa2[lVar21 + -3] * pdVar5[iVar4] + wa2[lVar21 + -2] * pdVar25[iVar4]) *
                  -0.8090169943749473 +
                 (wa4[lVar21 + -2] * pdVar23[iVar4] +
                 wa4[lVar21 + -3] * pdVar29[iVar4] +
                 wa1[lVar21 + -3] * pdVar15[iVar4] + wa1[lVar21 + -2] * pdVar6[iVar4]) *
                 0.30901699437494745 + pdVar17[iVar4]) -
                 (((wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2]) -
                  (wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2])) *
                  0.9510565162951535 +
                 ((wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2]) -
                 (wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2])) *
                 0.5877852522924732);
            local_190[lVar16] =
                 ((wa4[lVar21 + -3] * pdVar29[iVar4] + pdVar23[iVar4] * wa4[lVar21 + -2]) -
                 (wa1[lVar21 + -3] * pdVar15[iVar4] + pdVar6[iVar4] * wa1[lVar21 + -2])) *
                 0.9510565162951535 +
                 ((wa3[lVar21 + -3] * pdVar9[iVar4] + local_b0[iVar4] * wa3[lVar21 + -2]) -
                 (wa2[lVar21 + -3] * pdVar5[iVar4] + pdVar25[iVar4] * wa2[lVar21 + -2])) *
                 0.5877852522924732 +
                 ((wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2]) +
                 (wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2])) *
                 -0.8090169943749473 +
                 ((wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2]) +
                 (wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2])) *
                 0.30901699437494745 + local_1b8[iVar4];
            local_98[lVar16] =
                 (((wa4[lVar21 + -3] * pdVar29[iVar4] + wa4[lVar21 + -2] * pdVar23[iVar4]) -
                  (wa1[lVar21 + -3] * pdVar15[iVar4] + wa1[lVar21 + -2] * pdVar6[iVar4])) *
                  0.9510565162951535 +
                 ((wa3[lVar21 + -3] * pdVar9[iVar4] + wa3[lVar21 + -2] * local_b0[iVar4]) -
                 (wa2[lVar21 + -3] * pdVar5[iVar4] + wa2[lVar21 + -2] * pdVar25[iVar4])) *
                 0.5877852522924732) -
                 (((wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2]) +
                  (wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2])) *
                  -0.8090169943749473 +
                 ((wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2]) +
                 (wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2])) *
                 0.30901699437494745 + local_1b8[iVar4]);
            local_178[lVar16] =
                 ((wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2]) -
                 (wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2])) *
                 0.5877852522924732 +
                 ((wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2]) -
                 (wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2])) *
                 -0.9510565162951535 +
                 (wa3[lVar21 + -3] * pdVar9[iVar4] + wa3[lVar21 + -2] * local_b0[iVar4] +
                 wa2[lVar21 + -3] * pdVar5[iVar4] + wa2[lVar21 + -2] * pdVar25[iVar4]) *
                 0.30901699437494745 +
                 (wa4[lVar21 + -3] * pdVar29[iVar4] + wa4[lVar21 + -2] * pdVar23[iVar4] +
                 wa1[lVar21 + -3] * pdVar15[iVar4] + wa1[lVar21 + -2] * pdVar6[iVar4]) *
                 -0.8090169943749473 + pdVar17[iVar4];
            local_a0[lVar16] =
                 ((wa3[lVar21 + -3] * pdVar9[iVar4] + wa3[lVar21 + -2] * local_b0[iVar4] +
                  wa2[lVar21 + -3] * pdVar5[iVar4] + wa2[lVar21 + -2] * pdVar25[iVar4]) *
                  0.30901699437494745 +
                 (wa4[lVar21 + -3] * pdVar29[iVar4] + wa4[lVar21 + -2] * pdVar23[iVar4] +
                 wa1[lVar21 + -3] * pdVar15[iVar4] + wa1[lVar21 + -2] * pdVar6[iVar4]) *
                 -0.8090169943749473 + pdVar17[iVar4]) -
                 (((wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2]) -
                  (wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2])) *
                  0.5877852522924732 +
                 ((wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2]) -
                 (wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2])) *
                 -0.9510565162951535);
            local_198[lVar16] =
                 ((wa4[lVar21 + -3] * pdVar29[iVar4] + pdVar23[iVar4] * wa4[lVar21 + -2]) -
                 (wa1[lVar21 + -3] * pdVar15[iVar4] + pdVar6[iVar4] * wa1[lVar21 + -2])) *
                 0.5877852522924732 +
                 ((wa3[lVar21 + -3] * pdVar9[iVar4] + local_b0[iVar4] * wa3[lVar21 + -2]) -
                 (wa2[lVar21 + -3] * pdVar5[iVar4] + pdVar25[iVar4] * wa2[lVar21 + -2])) *
                 -0.9510565162951535 +
                 ((wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2]) +
                 (wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2])) *
                 0.30901699437494745 +
                 ((wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2]) +
                 (wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2])) *
                 -0.8090169943749473 + local_1b8[iVar4];
            local_1a0[lVar16] =
                 (((wa4[lVar21 + -3] * pdVar29[iVar4] + wa4[lVar21 + -2] * pdVar23[iVar4]) -
                  (wa1[lVar21 + -3] * pdVar15[iVar4] + wa1[lVar21 + -2] * pdVar6[iVar4])) *
                  0.5877852522924732 +
                 ((wa3[lVar21 + -3] * pdVar9[iVar4] + wa3[lVar21 + -2] * local_b0[iVar4]) -
                 (wa2[lVar21 + -3] * pdVar5[iVar4] + wa2[lVar21 + -2] * pdVar25[iVar4])) *
                 -0.9510565162951535) -
                 (((wa3[lVar21 + -3] * local_b0[iVar4] - pdVar9[iVar4] * wa3[lVar21 + -2]) +
                  (wa2[lVar21 + -3] * pdVar25[iVar4] - pdVar5[iVar4] * wa2[lVar21 + -2])) *
                  0.30901699437494745 +
                 ((wa4[lVar21 + -3] * pdVar23[iVar4] - pdVar29[iVar4] * wa4[lVar21 + -2]) +
                 (wa1[lVar21 + -3] * pdVar6[iVar4] - pdVar15[iVar4] * wa1[lVar21 + -2])) *
                 -0.8090169943749473 + local_1b8[iVar4]);
            local_a8 = local_a8 + lVar20 * -2;
            local_a0 = local_a0 + lVar20 * -2;
            local_98 = local_98 + lVar20 * -2;
            local_198 = local_198 + lVar20 * 2;
            local_190 = local_190 + lVar20 * 2;
            lVar21 = lVar21 + 2;
            local_188 = local_188 + lVar20 * 2;
            local_b0 = local_b0 + lVar24 * 2;
            pdVar25 = pdVar25 + lVar24 * 2;
            pdVar23 = pdVar23 + lVar24 * 2;
            pdVar6 = pdVar6 + lVar24 * 2;
            pdVar17 = pdVar17 + lVar24 * 2;
            pdVar15 = pdVar15 + lVar24 * 2;
            local_1b8 = local_1b8 + lVar24 * 2;
            pdVar29 = pdVar29 + lVar24 * 2;
            pdVar5 = pdVar5 + lVar24 * 2;
            pdVar9 = pdVar9 + lVar24 * 2;
            local_1a0 = local_1a0 + lVar20 * -2;
            pdVar11 = pdVar11 + lVar20 * 2;
            local_180 = local_180 + lVar20 * 2;
            local_178 = local_178 + lVar20 * 2;
          } while (lVar21 <= lVar13);
        }
        uVar8 = uVar8 + 1;
        local_108 = local_108 + lVar14 * 5;
        local_110 = local_110 + lVar14 * 5;
        local_118 = local_118 + lVar14 * 5;
        local_120 = local_120 + lVar14 * 5;
        local_128 = local_128 + lVar14 * 5;
        local_130 = local_130 + lVar14 * 5;
        local_138 = local_138 + lVar14 * 5;
        local_b8 = local_b8 + lVar26;
        local_c0 = local_c0 + lVar26;
        local_c8 = local_c8 + lVar26;
        local_d0 = local_d0 + lVar26;
        local_d8 = local_d8 + lVar26;
        local_e0 = local_e0 + lVar26;
        local_e8 = local_e8 + lVar26;
        local_f0 = local_f0 + lVar26;
        local_f8 = local_f8 + lVar26;
        local_100 = local_100 + lVar26;
        local_140 = local_140 + lVar14 * 5;
        local_148 = local_148 + lVar14 * 5;
        local_150 = local_150 + lVar14 * 5;
      } while (uVar8 != uVar3);
    }
  }
  return 0;
}

Assistant:

int r1f5kf_(int *ido, int *l1, fft_real_t *cc, int *
	in1, fft_real_t *ch, int *in2, fft_real_t *wa1, fft_real_t *wa2, fft_real_t *wa3, fft_real_t *
	wa4)
{
    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     i__1, i__2;

    /* Builtin functions */

    /* Local variables */
     int i__, k, ic;
     fft_real_t arg, ti11, ti12, tr11, tr12;
     int idp2;


    /* Parameter adjustments */
    --wa4;
    --wa3;
    --wa2;
    --wa1;
    cc_dim1 = *in1;
    cc_dim2 = *ido;
    cc_dim3 = *l1;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */
    arg = atan(1.0) * 8.0 / 5.0;
    tr11 = cos(arg);
    ti11 = sin(arg);
    tr12 = cos(arg * 2.0);
    ti12 = sin(arg * 2.0);
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ch[((k * 5 + 1) * ch_dim2 + 1) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		cc_dim2 + 1) * cc_dim1 + 1] + (cc[((k + cc_dim3 * 5) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + (cc[((k + (cc_dim3 << 2)) *
		cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) * cc_dim2
		+ 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr11 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr12 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 3) * ch_dim2 + 1) * ch_dim1 + 1] = ti11 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) + ti12 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
	ch[(*ido + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[((k + cc_dim3) *
		 cc_dim2 + 1) * cc_dim1 + 1] + tr12 * (cc[((k + cc_dim3 * 5) *
		 cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + (cc_dim3 << 1)) *
		cc_dim2 + 1) * cc_dim1 + 1]) + tr11 * (cc[((k + (cc_dim3 << 2)
		) * cc_dim2 + 1) * cc_dim1 + 1] + cc[((k + cc_dim3 * 3) *
		cc_dim2 + 1) * cc_dim1 + 1]);
	ch[((k * 5 + 5) * ch_dim2 + 1) * ch_dim1 + 1] = ti12 * (cc[((k +
		cc_dim3 * 5) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k + (
		cc_dim3 << 1)) * cc_dim2 + 1) * cc_dim1 + 1]) - ti11 * (cc[((
		k + (cc_dim3 << 2)) * cc_dim2 + 1) * cc_dim1 + 1] - cc[((k +
		cc_dim3 * 3) * cc_dim2 + 1) * cc_dim1 + 1]);
/* L101: */
    }
    if (*ido == 1) {
	return 0;
    }
    idp2 = *ido + 2;
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	i__2 = *ido;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    ic = idp2 - i__;
	    ch[(i__ - 1 + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ - 1 + (
		    k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 1]
		    * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1]))
		    + (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ + (k * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2)
		     * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]));
	    ch[(i__ - 1 + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) + ti11 * (wa1[i__ - 2] * cc[(i__
		    + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] - wa1[
		    i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k + cc_dim3 *
		    5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] * cc[(i__ - 1
		    + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])) + ti12 * (
		    wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] * cc[(i__ +
		    (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - wa3[i__
		    - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1]));
	    ch[(ic - 1 + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1]) + tr12 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		    3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 2]
		    * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1
		    + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1]) - (ti11 * (wa1[i__ - 2] * cc[(
		    i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + ti12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 3) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti11 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 2) * ch_dim2) * ch_dim1 + 1] = ti11 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) + ti12 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr12 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ - 1 + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(ic - 1 + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = cc[(i__ - 1
		    + (k + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[
		    i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) * cc_dim2) *
		     cc_dim1 + 1] + wa1[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    1)) * cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ -
		    1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] + wa4[i__
		    - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 +
		    1])) + tr11 * (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 *
		     3) * cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (
		    k + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2]
		     * cc[(i__ - 1 + (k + (cc_dim3 << 2)) * cc_dim2) *
		    cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1])) - (ti12 * (wa1[i__ - 2] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		    - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] - (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) - ti11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
	    ch[(i__ + (k * 5 + 5) * ch_dim2) * ch_dim1 + 1] = cc[(i__ + (k +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ - 2]
		    * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]
		     - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		    cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])) + (ti12 * (wa4[i__ - 2] * cc[(
		    i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] +
		    wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 + (k + (
		    cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__ - 1] *
		    cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1]))
		     - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k + (cc_dim3 <<
		    2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1] * cc[(i__ + (
		    k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] - (wa2[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) * cc_dim2) *
		    cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k + cc_dim3 * 3)
		    * cc_dim2) * cc_dim1 + 1])));
	    ch[(ic + (k * 5 + 4) * ch_dim2) * ch_dim1 + 1] = ti12 * (wa4[i__
		    - 2] * cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) *
		    cc_dim1 + 1] + wa4[i__ - 1] * cc[(i__ + (k + cc_dim3 * 5)
		    * cc_dim2) * cc_dim1 + 1] - (wa1[i__ - 2] * cc[(i__ - 1 +
		    (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] + wa1[i__
		    - 1] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) *
		    cc_dim1 + 1])) - ti11 * (wa3[i__ - 2] * cc[(i__ - 1 + (k
		    + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1] + wa3[i__ - 1]
		     * cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 +
		    1] - (wa2[i__ - 2] * cc[(i__ - 1 + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] + wa2[i__ - 1] * cc[(i__ + (k +
		    cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1])) - (cc[(i__ + (k
		    + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 * (wa1[i__ -
		    2] * cc[(i__ + (k + (cc_dim3 << 1)) * cc_dim2) * cc_dim1
		    + 1] - wa1[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 1)) *
		     cc_dim2) * cc_dim1 + 1] + (wa4[i__ - 2] * cc[(i__ + (k +
		    cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1] - wa4[i__ - 1] *
		    cc[(i__ - 1 + (k + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1])
		    ) + tr11 * (wa2[i__ - 2] * cc[(i__ + (k + cc_dim3 * 3) *
		    cc_dim2) * cc_dim1 + 1] - wa2[i__ - 1] * cc[(i__ - 1 + (k
		    + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + (wa3[i__ - 2] *
		     cc[(i__ + (k + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1]
		    - wa3[i__ - 1] * cc[(i__ - 1 + (k + (cc_dim3 << 2)) *
		    cc_dim2) * cc_dim1 + 1])));
/* L102: */
	}
/* L103: */
    }
    return 0;
}